

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateMergeFromCodedStream
          (MessageGenerator *this,Printer *printer)

{
  string *value;
  bool bVar1;
  bool bVar2;
  Type TVar3;
  Descriptor *pDVar4;
  FieldGenerator *pFVar5;
  uint uVar6;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint extraout_EDX_01;
  uint extraout_EDX_02;
  uint extraout_EDX_03;
  uint extraout_EDX_04;
  uint extraout_EDX_05;
  uint uVar7;
  int i;
  uint extraout_EDX_06;
  uint extraout_EDX_07;
  uint i_00;
  uint i_01;
  uint extraout_EDX_08;
  uint i_02;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 uVar8;
  long lVar9;
  int iVar10;
  protobuf *ppVar11;
  char *pcVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  MessageGenerator *pMVar16;
  FieldDescriptor *pFVar17;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ordered_fields;
  string local_98;
  MessageGenerator *local_78;
  FieldGeneratorMap *local_70;
  string local_68;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_48;
  
  if (*(char *)(*(long *)(this->descriptor_ + 0x20) + 0x68) == '\x01') {
    io::Printer::Print(printer,
                       "bool $classname$::MergePartialFromCodedStream(\n    ::google::protobuf::io::CodedInputStream* input) {\n"
                       ,"classname",&this->classname_);
    io::Printer::Print(printer,
                       "  return _extensions_.ParseMessageSet(input, internal_default_instance(),\n                                      mutable_unknown_fields());\n"
                       ,"classname",&this->classname_);
    io::Printer::Print(printer,"}\n");
    return;
  }
  anon_unknown_0::SortFieldsByNumber(&local_48,this->descriptor_);
  value = &this->classname_;
  io::Printer::Print(printer,
                     "bool $classname$::MergePartialFromCodedStream(\n    ::google::protobuf::io::CodedInputStream* input) {\n"
                     ,"classname",value);
  if (this->table_driven_ == true) {
    io::Printer::Indent(printer);
    FileLevelNamespace(&local_98,(string *)**(undefined8 **)(this->descriptor_ + 0x10));
    io::Printer::Print(printer,
                       "return ::google::protobuf::internal::MergePartialFromCodedStream(\n    this,\n    $file_namespace$::TableStruct::schema[\n      $classname$::kIndexInFileMessages],\n    input);\n"
                       ,"classname",value,"file_namespace",&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"}\n");
  }
  else {
    io::Printer::Print(printer,
                       "#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure\n  ::google::protobuf::uint32 tag;\n"
                      );
    if ((*(int *)(*(long *)(this->descriptor_ + 0x10) + 0x8c) != 3) &&
       (((this->options_).enforce_lite != false ||
        (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0xa0) + 0xa8) == 3)))) {
      io::Printer::Print(printer,
                         "  ::google::protobuf::io::LazyStringOutputStream unknown_fields_string(\n      ::google::protobuf::NewPermanentCallback(&_internal_metadata_,\n          &::google::protobuf::internal::InternalMetadataWithArenaLite::\n              mutable_unknown_fields));\n  ::google::protobuf::io::CodedOutputStream unknown_fields_stream(\n      &unknown_fields_string, false);\n"
                         ,"classname",value);
    }
    io::Printer::Print(printer,"  // @@protoc_insertion_point(parse_start:$full_name$)\n",
                       "full_name",*(string **)(this->descriptor_ + 8));
    io::Printer::Indent(printer);
    io::Printer::Print(printer,"for (;;) {\n");
    io::Printer::Indent(printer);
    if ((long)*(int *)(this->descriptor_ + 0x2c) == 0) {
      local_70 = (FieldGeneratorMap *)((ulong)local_70 & 0xffffffff00000000);
      uVar7 = extraout_EDX;
    }
    else {
      pFVar17 = local_48.
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_start
                [(long)*(int *)(this->descriptor_ + 0x2c) + -1];
      iVar10 = *(int *)(pFVar17 + 0x38);
      bVar2 = FieldDescriptor::is_packed(pFVar17);
      uVar6 = 2;
      uVar7 = extraout_EDX_00;
      if (!bVar2) {
        TVar3 = FieldDescriptor::type(pFVar17);
        uVar6 = *(uint *)(internal::WireFormatLite::kWireTypeForFieldType + (ulong)TVar3 * 4);
        uVar7 = extraout_EDX_01;
      }
      local_70 = (FieldGeneratorMap *)CONCAT44(local_70._4_4_,iVar10 << 3 | uVar6);
    }
    lVar15 = *(long *)(this->descriptor_ + 0x18);
    local_78 = this;
    if ((lVar15 == 0) || (*(int *)(lVar15 + 0x2c) < 1)) {
      bVar2 = false;
    }
    else {
      lVar13 = 0;
      lVar9 = 0;
      bVar2 = false;
      do {
        pFVar17 = (FieldDescriptor *)(*(long *)(lVar15 + 0x30) + lVar13);
        TVar3 = FieldDescriptor::type(pFVar17);
        uVar7 = extraout_EDX_02;
        if ((TVar3 == TYPE_GROUP) &&
           (pDVar4 = FieldDescriptor::message_type(pFVar17), uVar7 = extraout_EDX_03,
           pDVar4 == local_78->descriptor_)) {
          bVar2 = true;
          bVar1 = false;
        }
        else {
          bVar1 = true;
        }
        if (!bVar1) break;
        lVar9 = lVar9 + 1;
        lVar13 = lVar13 + 0xa8;
      } while (lVar9 < *(int *)(lVar15 + 0x2c));
    }
    lVar15 = *(long *)(local_78->descriptor_ + 0x10);
    if (0 < *(int *)(lVar15 + 0x88)) {
      lVar9 = 0;
      lVar13 = 0;
      do {
        pFVar17 = (FieldDescriptor *)(*(long *)(lVar15 + 0x98) + lVar9);
        TVar3 = FieldDescriptor::type(pFVar17);
        uVar7 = extraout_EDX_04;
        if ((TVar3 == TYPE_GROUP) &&
           (pDVar4 = FieldDescriptor::message_type(pFVar17), uVar7 = extraout_EDX_05,
           pDVar4 == local_78->descriptor_)) {
          bVar2 = true;
          bVar1 = false;
        }
        else {
          bVar1 = true;
        }
        if (!bVar1) break;
        lVar13 = lVar13 + 1;
        lVar15 = *(long *)(local_78->descriptor_ + 0x10);
        lVar9 = lVar9 + 0xa8;
      } while (lVar13 < *(int *)(lVar15 + 0x88));
    }
    uVar6 = 0x3fff;
    if (0x3fff < (uint)local_70) {
      uVar6 = (uint)local_70;
    }
    ppVar11 = (protobuf *)0x7f;
    if (0x7f < (uint)local_70) {
      ppVar11 = (protobuf *)(ulong)uVar6;
    }
    SimpleItoa_abi_cxx11_(&local_98,ppVar11,uVar7);
    iVar10 = 0x36a365;
    if (bVar2) {
      iVar10 = 0x357e26;
    }
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,iVar10,((byte)~bVar2 & 1) * 9 + iVar10);
    io::Printer::Print(printer,
                       "::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoff$lasttag$($max$u);\ntag = p.first;\nif (!p.second) goto handle_unusual;\n"
                       ,"max",&local_98,"lasttag",&local_68);
    pMVar16 = local_78;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if (0 < *(int *)(pMVar16->descriptor_ + 0x2c)) {
      io::Printer::Print(printer,
                         "switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {\n"
                        );
      io::Printer::Indent(printer);
      if (local_48.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_48.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        local_70 = &local_78->field_generators_;
        uVar14 = 0;
        do {
          pFVar17 = local_48.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar14];
          anon_unknown_0::PrintFieldComment<google::protobuf::FieldDescriptor>(printer,pFVar17);
          SimpleItoa_abi_cxx11_(&local_98,(protobuf *)(ulong)*(uint *)(pFVar17 + 0x38),i);
          io::Printer::Print(printer,"case $number$: {\n","number",&local_98);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          io::Printer::Indent(printer);
          pFVar5 = FieldGeneratorMap::get(local_70,pFVar17);
          iVar10 = *(int *)(pFVar17 + 0x38);
          bVar2 = FieldDescriptor::is_packed(pFVar17);
          uVar7 = 2;
          uVar6 = extraout_EDX_06;
          if (!bVar2) {
            TVar3 = FieldDescriptor::type(pFVar17);
            uVar7 = *(uint *)(internal::WireFormatLite::kWireTypeForFieldType + (ulong)TVar3 * 4);
            uVar6 = extraout_EDX_07;
          }
          SimpleItoa_abi_cxx11_(&local_98,(protobuf *)(ulong)(iVar10 << 3 | uVar7),uVar6);
          io::Printer::Print(printer,
                             "if (static_cast< ::google::protobuf::uint8>(tag) ==\n    static_cast< ::google::protobuf::uint8>($commontag$u)) {\n"
                             ,"commontag",&local_98);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          io::Printer::Indent(printer);
          bVar2 = FieldDescriptor::is_packed(pFVar17);
          (*pFVar5->_vptr_FieldGenerator[(ulong)bVar2 + 0x13])(pFVar5,printer);
          io::Printer::Outdent(printer);
          bVar2 = FieldDescriptor::is_packed(pFVar17);
          if (bVar2) {
            TVar3 = FieldDescriptor::type(pFVar17);
            SimpleItoa_abi_cxx11_
                      (&local_98,
                       (protobuf *)
                       (ulong)(*(int *)(pFVar17 + 0x38) << 3 |
                              *(uint *)(internal::WireFormatLite::kWireTypeForFieldType +
                                       (ulong)TVar3 * 4)),i_00);
            io::Printer::Print(printer,
                               "} else if (static_cast< ::google::protobuf::uint8>(tag) ==\n           static_cast< ::google::protobuf::uint8>($uncommontag$u)) {\n"
                               ,"uncommontag",&local_98);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
            }
            io::Printer::Indent(printer);
            (*pFVar5->_vptr_FieldGenerator[0x13])(pFVar5,printer);
            io::Printer::Outdent(printer);
          }
          else if (((*(int *)(pFVar17 + 0x4c) == 3) &&
                   (TVar3 = FieldDescriptor::type(pFVar17), TVar3 - TYPE_UINT32 < 0xfffffffc)) &&
                  (bVar2 = FieldDescriptor::is_packed(pFVar17), !bVar2)) {
            SimpleItoa_abi_cxx11_
                      (&local_98,(protobuf *)(ulong)(*(int *)(pFVar17 + 0x38) * 8 + 2),i_01);
            io::Printer::Print(printer,
                               "} else if (static_cast< ::google::protobuf::uint8>(tag) ==\n           static_cast< ::google::protobuf::uint8>($uncommontag$u)) {\n"
                               ,"uncommontag",&local_98);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
            }
            io::Printer::Indent(printer);
            (*pFVar5->_vptr_FieldGenerator[0x14])(pFVar5,printer);
            io::Printer::Outdent(printer);
          }
          io::Printer::Print(printer,"} else {\n  goto handle_unusual;\n}\n");
          io::Printer::Print(printer,"break;\n");
          io::Printer::Outdent(printer);
          io::Printer::Print(printer,"}\n\n");
          uVar14 = uVar14 + 1;
        } while (uVar14 < (ulong)((long)local_48.
                                        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_48.
                                        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
      io::Printer::Print(printer,"default: {\n");
      pMVar16 = local_78;
      io::Printer::Indent(printer);
    }
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"handle_unusual:\n");
    io::Printer::Indent(printer);
    io::Printer::Print(printer,
                       "if (tag == 0 ||\n    ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==\n    ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {\n  goto success;\n}\n"
                      );
    if (0 < *(int *)(pMVar16->descriptor_ + 0x68)) {
      io::Printer::Print(printer,"if (");
      pDVar4 = pMVar16->descriptor_;
      if (0 < *(int *)(pDVar4 + 0x68)) {
        lVar15 = 0;
        uVar8 = extraout_RDX;
        do {
          uVar7 = (uint)uVar8;
          lVar9 = *(long *)(pDVar4 + 0x70);
          if (lVar15 != 0) {
            io::Printer::Print(printer," ||\n    ");
            uVar7 = extraout_EDX_08;
          }
          iVar10 = *(int *)(lVar9 + 4 + lVar15 * 8);
          ppVar11 = (protobuf *)(ulong)(uint)(*(int *)(lVar9 + lVar15 * 8) << 3);
          if (iVar10 < 0x20000000) {
            SimpleItoa_abi_cxx11_(&local_98,ppVar11,uVar7);
            SimpleItoa_abi_cxx11_(&local_68,(protobuf *)(ulong)(uint)(iVar10 << 3),i_02);
            io::Printer::Print(printer,"($start$u <= tag && tag < $end$u)","start",&local_98,"end",
                               &local_68);
            uVar8 = extraout_RDX_01;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != &local_68.field_2) {
              operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
              uVar8 = extraout_RDX_02;
            }
          }
          else {
            SimpleItoa_abi_cxx11_(&local_98,ppVar11,uVar7);
            io::Printer::Print(printer,"($start$u <= tag)","start",&local_98);
            uVar8 = extraout_RDX_00;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
            uVar8 = extraout_RDX_03;
          }
          lVar15 = lVar15 + 1;
          pDVar4 = local_78->descriptor_;
        } while (lVar15 < *(int *)(pDVar4 + 0x68));
      }
      io::Printer::Print(printer,") {\n");
      pMVar16 = local_78;
      if (*(int *)(*(long *)(local_78->descriptor_ + 0x10) + 0x8c) == 3) {
        pcVar12 = "  DO_(_extensions_.ParseField(tag, input, internal_default_instance());\n";
      }
      else if (((local_78->options_).enforce_lite == false) &&
              (*(int *)(*(long *)(*(long *)(local_78->descriptor_ + 0x10) + 0xa0) + 0xa8) != 3)) {
        pcVar12 = 
        "  DO_(_extensions_.ParseField(tag, input, internal_default_instance(),\n                              mutable_unknown_fields()));\n"
        ;
      }
      else {
        pcVar12 = 
        "  DO_(_extensions_.ParseField(tag, input, internal_default_instance(),\n                              &unknown_fields_stream));\n"
        ;
      }
      io::Printer::Print(printer,pcVar12);
      io::Printer::Print(printer,"  continue;\n}\n");
    }
    if (*(int *)(*(long *)(pMVar16->descriptor_ + 0x10) + 0x8c) == 3) {
      pcVar12 = "DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));\n";
    }
    else if (((pMVar16->options_).enforce_lite == false) &&
            (*(int *)(*(long *)(*(long *)(pMVar16->descriptor_ + 0x10) + 0xa0) + 0xa8) != 3)) {
      pcVar12 = 
      "DO_(::google::protobuf::internal::WireFormat::SkipField(\n      input, tag, mutable_unknown_fields()));\n"
      ;
    }
    else {
      pcVar12 = 
      "DO_(::google::protobuf::internal::WireFormatLite::SkipField(\n    input, tag, &unknown_fields_stream));\n"
      ;
    }
    io::Printer::Print(printer,pcVar12);
    if (0 < *(int *)(pMVar16->descriptor_ + 0x2c)) {
      io::Printer::Print(printer,"break;\n");
      io::Printer::Outdent(printer);
      io::Printer::Print(printer,"}\n");
      io::Printer::Outdent(printer);
      io::Printer::Print(printer,"}\n");
    }
    io::Printer::Outdent(printer);
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,
                       "  }\nsuccess:\n  // @@protoc_insertion_point(parse_success:$full_name$)\n  return true;\nfailure:\n  // @@protoc_insertion_point(parse_failure:$full_name$)\n  return false;\n#undef DO_\n}\n"
                       ,"full_name",*(string **)(pMVar16->descriptor_ + 8));
  }
  if (local_48.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void MessageGenerator::
GenerateMergeFromCodedStream(io::Printer* printer) {
  if (descriptor_->options().message_set_wire_format()) {
    // Special-case MessageSet.
    printer->Print(
      "bool $classname$::MergePartialFromCodedStream(\n"
      "    ::google::protobuf::io::CodedInputStream* input) {\n",
      "classname", classname_);

    printer->Print(
        "  return _extensions_.ParseMessageSet(input, "
        "internal_default_instance(),\n"
        "                                      mutable_unknown_fields());\n",
        // Vars.
        "classname", classname_);

    printer->Print(
      "}\n");
    return;
  }

  std::vector<const FieldDescriptor*> ordered_fields =
      SortFieldsByNumber(descriptor_);

  printer->Print(
    "bool $classname$::MergePartialFromCodedStream(\n"
    "    ::google::protobuf::io::CodedInputStream* input) {\n",
    "classname", classname_);

  if (table_driven_) {
    printer->Indent();

    printer->Print(
        "return ::google::protobuf::internal::MergePartialFromCodedStream(\n"
        "    this,\n"
        "    $file_namespace$::TableStruct::schema[\n"
        "      $classname$::kIndexInFileMessages],\n"
        "    input);\n",
        "classname", classname_,
        "file_namespace", FileLevelNamespace(descriptor_->file()->name()));

    printer->Outdent();

    printer->Print("}\n");
    return;
  }

  printer->Print(
    "#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure\n"
    "  ::google::protobuf::uint32 tag;\n");

  if (PreserveUnknownFields(descriptor_) &&
      !UseUnknownFieldSet(descriptor_->file(), options_)) {
    // Use LazyStringOutputString to avoid initializing unknown fields string
    // unless it is actually needed. For the same reason, disable eager refresh
    // on the CodedOutputStream.
    printer->Print(
      "  ::google::protobuf::io::LazyStringOutputStream unknown_fields_string(\n"
      "      ::google::protobuf::NewPermanentCallback(&_internal_metadata_,\n"
      "          &::google::protobuf::internal::InternalMetadataWithArenaLite::\n"
      "              mutable_unknown_fields));\n"
      "  ::google::protobuf::io::CodedOutputStream unknown_fields_stream(\n"
      "      &unknown_fields_string, false);\n",
      "classname", classname_);
  }

  printer->Print(
    "  // @@protoc_insertion_point(parse_start:$full_name$)\n",
    "full_name", descriptor_->full_name());

  printer->Indent();
  printer->Print("for (;;) {\n");
  printer->Indent();

  uint32 maxtag = descriptor_->field_count() == 0 ? 0 :
      WireFormat::MakeTag(ordered_fields[descriptor_->field_count() - 1]);
  const int kCutoff0 = 127;               // fits in 1-byte varint
  const int kCutoff1 = (127 << 7) + 127;  // fits in 2-byte varint

  // We need to capture the last tag when parsing if this is a Group type, as
  // our caller will verify (via CodedInputStream::LastTagWas) that the correct
  // closing tag was received.
  bool capture_last_tag = false;
  const Descriptor* parent = descriptor_->containing_type();
  if (parent) {
    for (int i = 0; i < parent->field_count(); i++) {
      const FieldDescriptor* field = parent->field(i);
      if (field->type() == FieldDescriptor::TYPE_GROUP &&
          field->message_type() == descriptor_) {
        capture_last_tag = true;
        break;
      }
    }
  }

  for (int i = 0; i < descriptor_->file()->extension_count(); i++) {
    const FieldDescriptor* field = descriptor_->file()->extension(i);
    if (field->type() == FieldDescriptor::TYPE_GROUP &&
        field->message_type() == descriptor_) {
      capture_last_tag = true;
      break;
    }
  }

  printer->Print("::std::pair< ::google::protobuf::uint32, bool> p = "
                 "input->ReadTagWithCutoff$lasttag$($max$u);\n"
                 "tag = p.first;\n"
                 "if (!p.second) goto handle_unusual;\n",
                 "max", SimpleItoa(maxtag <= kCutoff0 ? kCutoff0 :
                                   (maxtag <= kCutoff1 ? kCutoff1 :
                                    maxtag)),
                 "lasttag", !capture_last_tag ? "NoLastTag" : "");

  if (descriptor_->field_count() > 0) {
    // We don't even want to print the switch() if we have no fields because
    // MSVC dislikes switch() statements that contain only a default value.

    // Note:  If we just switched on the tag rather than the field number, we
    // could avoid the need for the if() to check the wire type at the beginning
    // of each case.  However, this is actually a bit slower in practice as it
    // creates a jump table that is 8x larger and sparser, and meanwhile the
    // if()s are highly predictable.
    //
    // Historically, we inserted checks to peek at the next tag on the wire and
    // jump directly to the next case statement.  While this avoids the jump
    // table that the switch uses, it greatly increases code size (20-60%) and
    // inserts branches that may fail (especially for real world protos that
    // interleave--in field number order--hot and cold fields).  Loadtests
    // confirmed that removing this optimization is performance neutral.
    printer->Print("switch (::google::protobuf::internal::WireFormatLite::"
                   "GetTagFieldNumber(tag)) {\n");

    printer->Indent();

    for (int i = 0; i < ordered_fields.size(); i++) {
      const FieldDescriptor* field = ordered_fields[i];

      PrintFieldComment(printer, field);

      printer->Print(
        "case $number$: {\n",
        "number", SimpleItoa(field->number()));
      printer->Indent();
      const FieldGenerator& field_generator = field_generators_.get(field);

      // Emit code to parse the common, expected case.
      printer->Print("if (static_cast< ::google::protobuf::uint8>(tag) ==\n"
                     "    static_cast< ::google::protobuf::uint8>($commontag$u)) {\n",
          "commontag", SimpleItoa(WireFormat::MakeTag(field)));

      printer->Indent();
      if (field->is_packed()) {
        field_generator.GenerateMergeFromCodedStreamWithPacking(printer);
      } else {
        field_generator.GenerateMergeFromCodedStream(printer);
      }
      printer->Outdent();

      // Emit code to parse unexpectedly packed or unpacked values.
      if (field->is_packed()) {
        internal::WireFormatLite::WireType wiretype =
            WireFormat::WireTypeForFieldType(field->type());
        printer->Print("} else if (static_cast< ::google::protobuf::uint8>(tag) ==\n"
                       "           static_cast< ::google::protobuf::uint8>($uncommontag$u)) {\n",
                       "uncommontag", SimpleItoa(
                           internal::WireFormatLite::MakeTag(
                               field->number(), wiretype)));
        printer->Indent();
        field_generator.GenerateMergeFromCodedStream(printer);
        printer->Outdent();
      } else if (field->is_packable() && !field->is_packed()) {
        internal::WireFormatLite::WireType wiretype =
            internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED;
        printer->Print("} else if (static_cast< ::google::protobuf::uint8>(tag) ==\n"
                       "           static_cast< ::google::protobuf::uint8>($uncommontag$u)) {\n",
                       "uncommontag", SimpleItoa(
                           internal::WireFormatLite::MakeTag(
                               field->number(), wiretype)));
        printer->Indent();
        field_generator.GenerateMergeFromCodedStreamWithPacking(printer);
        printer->Outdent();
      }

      printer->Print(
        "} else {\n"
        "  goto handle_unusual;\n"
        "}\n");

      printer->Print(
        "break;\n");

      printer->Outdent();
      printer->Print("}\n\n");
    }

    printer->Print("default: {\n");
    printer->Indent();
  }

  printer->Outdent();
  printer->Print("handle_unusual:\n");
  printer->Indent();
  // If tag is 0 or an end-group tag then this must be the end of the message.
  printer->Print(
    "if (tag == 0 ||\n"
    "    ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==\n"
    "    ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {\n"
    "  goto success;\n"
    "}\n");

  // Handle extension ranges.
  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
      "if (");
    for (int i = 0; i < descriptor_->extension_range_count(); i++) {
      const Descriptor::ExtensionRange* range =
        descriptor_->extension_range(i);
      if (i > 0) printer->Print(" ||\n    ");

      uint32 start_tag = WireFormatLite::MakeTag(
        range->start, static_cast<WireFormatLite::WireType>(0));
      uint32 end_tag = WireFormatLite::MakeTag(
        range->end, static_cast<WireFormatLite::WireType>(0));

      if (range->end > FieldDescriptor::kMaxNumber) {
        printer->Print(
          "($start$u <= tag)",
          "start", SimpleItoa(start_tag));
      } else {
        printer->Print(
          "($start$u <= tag && tag < $end$u)",
          "start", SimpleItoa(start_tag),
          "end", SimpleItoa(end_tag));
      }
    }
    printer->Print(") {\n");
    if (PreserveUnknownFields(descriptor_)) {
      if (UseUnknownFieldSet(descriptor_->file(), options_)) {
        printer->Print(
            "  DO_(_extensions_.ParseField(tag, input, "
            "internal_default_instance(),\n"
            "                              mutable_unknown_fields()));\n");
      } else {
        printer->Print(
            "  DO_(_extensions_.ParseField(tag, input, "
            "internal_default_instance(),\n"
            "                              &unknown_fields_stream));\n");
      }
    } else {
      printer->Print(
          // With static initializers.
          "  DO_(_extensions_.ParseField(tag, input, "
          "internal_default_instance());\n");
    }
    printer->Print(
      "  continue;\n"
      "}\n");
  }

  // We really don't recognize this tag.  Skip it.
  if (PreserveUnknownFields(descriptor_)) {
    if (UseUnknownFieldSet(descriptor_->file(), options_)) {
      printer->Print(
        "DO_(::google::protobuf::internal::WireFormat::SkipField(\n"
        "      input, tag, mutable_unknown_fields()));\n");
    } else {
      printer->Print(
        "DO_(::google::protobuf::internal::WireFormatLite::SkipField(\n"
        "    input, tag, &unknown_fields_stream));\n");
    }
  } else {
    printer->Print(
      "DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));\n");
  }

  if (descriptor_->field_count() > 0) {
    printer->Print("break;\n");
    printer->Outdent();
    printer->Print("}\n");    // default:
    printer->Outdent();
    printer->Print("}\n");    // switch
  }

  printer->Outdent();
  printer->Outdent();
  printer->Print(
    "  }\n"                   // for (;;)
    "success:\n"
    "  // @@protoc_insertion_point(parse_success:$full_name$)\n"
    "  return true;\n"
    "failure:\n"
    "  // @@protoc_insertion_point(parse_failure:$full_name$)\n"
    "  return false;\n"
    "#undef DO_\n"
    "}\n", "full_name", descriptor_->full_name());
}